

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qneg_s64_arm(CPUARMState *env,uint64_t x)

{
  uint64_t local_18;
  uint64_t x_local;
  CPUARMState *env_local;
  
  if (x == 0x8000000000000000) {
    (env->vfp).qc[0] = 1;
    local_18 = 0x7fffffffffffffff;
  }
  else {
    local_18 = -x;
  }
  return local_18;
}

Assistant:

uint64_t HELPER(neon_qneg_s64)(CPUARMState *env, uint64_t x)
{
    if (x == SIGNBIT64) {
        SET_QC();
        x = ~SIGNBIT64;
    } else {
#ifdef _MSC_VER
        x = 0 - x;
#else
        x = -x;
#endif
    }
    return x;
}